

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t size;
  void *start;
  size_t local_100;
  ZSTD_CDict *cdict;
  ZSTD_cwksp ws;
  void *workspace;
  size_t workspaceSize;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dictBuffer_local;
  
  if ((customMem.customAlloc == (ZSTD_allocFunction)0x0) ==
      (customMem.customFree == (ZSTD_freeFunction)0x0)) {
    sVar2 = ZSTD_cwksp_alloc_size(0x1340);
    sVar3 = ZSTD_cwksp_alloc_size(0x1800);
    sVar4 = ZSTD_sizeof_matchState(&cParams,0);
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      local_100 = 0;
    }
    else {
      size = ZSTD_cwksp_align(dictSize,8);
      local_100 = ZSTD_cwksp_alloc_size(size);
    }
    local_100 = sVar2 + sVar3 + sVar4 + local_100;
    ws._56_8_ = customMem.customAlloc;
    start = ZSTD_malloc(local_100,customMem);
    if (start == (void *)0x0) {
      ZSTD_free((void *)0x0,customMem);
      dictBuffer_local = (void *)0x0;
    }
    else {
      ZSTD_cwksp_init((ZSTD_cwksp *)&cdict,start,local_100);
      dictBuffer_local = ZSTD_cwksp_reserve_object((ZSTD_cwksp *)&cdict,0x1340);
      if ((ZSTD_CDict *)dictBuffer_local == (ZSTD_CDict *)0x0) {
        __assert_fail("cdict != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3789,
                      "ZSTD_CDict *ZSTD_createCDict_advanced(const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_compressionParameters, ZSTD_customMem)"
                     );
      }
      ZSTD_cwksp_move(&((ZSTD_CDict *)dictBuffer_local)->workspace,(ZSTD_cwksp *)&cdict);
      (((ZSTD_CDict *)dictBuffer_local)->customMem).customAlloc = customMem.customAlloc;
      (((ZSTD_CDict *)dictBuffer_local)->customMem).customFree = customMem.customFree;
      (((ZSTD_CDict *)dictBuffer_local)->customMem).opaque = customMem.opaque;
      ((ZSTD_CDict *)dictBuffer_local)->compressionLevel = 0;
      sVar2 = ZSTD_initCDict_internal
                        ((ZSTD_CDict *)dictBuffer_local,dictBuffer,dictSize,dictLoadMethod,
                         dictContentType,cParams);
      uVar1 = ZSTD_isError(sVar2);
      if (uVar1 != 0) {
        ZSTD_freeCDict((ZSTD_CDict *)dictBuffer_local);
        dictBuffer_local = (void *)0x0;
      }
    }
  }
  else {
    dictBuffer_local = (void *)0x0;
  }
  return (ZSTD_CDict *)dictBuffer_local;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams, ZSTD_customMem customMem)
{
    DEBUGLOG(3, "ZSTD_createCDict_advanced, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    {   size_t const workspaceSize =
            ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict)) +
            ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE) +
            ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0) +
            (dictLoadMethod == ZSTD_dlm_byRef ? 0
             : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))));
        void* const workspace = ZSTD_malloc(workspaceSize, customMem);
        ZSTD_cwksp ws;
        ZSTD_CDict* cdict;

        if (!workspace) {
            ZSTD_free(workspace, customMem);
            return NULL;
        }

        ZSTD_cwksp_init(&ws, workspace, workspaceSize);

        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        assert(cdict != NULL);
        ZSTD_cwksp_move(&cdict->workspace, &ws);
        cdict->customMem = customMem;
        cdict->compressionLevel = 0; /* signals advanced API usage */

        if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                        dictBuffer, dictSize,
                                        dictLoadMethod, dictContentType,
                                        cParams) )) {
            ZSTD_freeCDict(cdict);
            return NULL;
        }

        return cdict;
    }
}